

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O3

void __thiscall
afsm::
state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
defer_event<afsm::test::events::comma>
          (state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
           *this,comma *event)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  id_type *local_20;
  
  p_Var2 = (_List_node_base *)operator_new(0x38);
  p_Var2[1]._M_prev = (_List_node_base *)this;
  p_Var2[2]._M_prev =
       (_List_node_base *)
       std::
       _Function_handler<afsm::actions::event_process_result_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/include/afsm/fsm.hpp:391:39)>
       ::_M_invoke;
  p_Var2[2]._M_next =
       (_List_node_base *)
       std::
       _Function_handler<afsm::actions::event_process_result_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/include/afsm/fsm.hpp:391:39)>
       ::_M_manager;
  p_Var2[3]._M_next = (_List_node_base *)&detail::event<afsm::test::events::comma>::id;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->deferred_events_).
            super__List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  local_20 = (id_type *)&detail::event<afsm::test::events::comma>::id;
  std::
  _Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
  ::_M_insert_unique<afsm::detail::event_base::id_type_const*>
            ((_Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
              *)&this->deferred_event_ids_,&local_20);
  return;
}

Assistant:

void
    defer_event(Event&& event)
    {
        using evt_identity = typename detail::event_identity<Event>::type;

        observer_wrapper::defer_event(*this, ::std::forward<Event>(event));
        Event evt{::std::forward<Event>(event)};
        deferred_events_.emplace_back([&, evt]() mutable {
            return process_event_dispatch(::std::move(evt));
        }, &evt_identity::id);
        deferred_event_ids_.insert(&evt_identity::id);
    }